

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidget *treeview,QTreeWidgetItem *after,int type)

{
  long lVar1;
  long *plVar2;
  QTreeWidgetItem *this_00;
  long lVar3;
  QTreeWidgetItemPrivate *pQVar4;
  QTreeModel *pQVar5;
  int iVar6;
  long lVar7;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_0081e7f0;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  pQVar4 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar4->q = this;
  (pQVar4->display).d.d = (Data *)0x0;
  (pQVar4->display).d.ptr = (QVariant *)0x0;
  (pQVar4->display).d.size = 0;
  pQVar4->field_0x20 = pQVar4->field_0x20 & 0xf8;
  pQVar4->rowGuess = -1;
  pQVar4->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar4;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  pQVar5 = treeModel(this,treeview);
  if (pQVar5 == (QTreeModel *)0x0) {
    return;
  }
  this_00 = pQVar5->rootItem;
  lVar3 = (this_00->children).d.size;
  if (lVar3 != 0) {
    lVar7 = -8;
    do {
      iVar6 = (int)treeview;
      lVar1 = lVar3 * -8 + lVar7;
      if (lVar1 == -8) goto LAB_005bc682;
      treeview = (QTreeWidget *)(lVar7 + 8);
      plVar2 = (long *)((long)((this_00->children).d.ptr + 1) + lVar7);
      lVar7 = (long)treeview;
    } while ((QTreeWidgetItem *)*plVar2 != after);
    iVar6 = (int)((long)treeview >> 3);
LAB_005bc682:
    if (lVar1 != -8) goto LAB_005bc68f;
  }
  iVar6 = -1;
LAB_005bc68f:
  insertChild(this_00,iVar6 + 1,this);
  QList<QList<QWidgetItemData>_>::reserve
            (&this->values,(long)(int)(pQVar5->headerItem->values).d.size);
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, QTreeWidgetItem *after, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        int i = model->rootItem->children.indexOf(after) + 1;
        model->rootItem->insertChild(i, this);
        values.reserve(model->headerItem->columnCount());
    }
}